

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O2

void __thiscall xatlas::internal::param::Chart::~Chart(Chart *this)

{
  char *in_RCX;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int in_R8D;
  
  if (this->m_mesh != (Mesh *)0x0) {
    Mesh::~Mesh(this->m_mesh);
    Realloc(this->m_mesh,0,extraout_EDX,in_RCX,in_R8D);
  }
  if (this->m_unifiedMesh != (Mesh *)0x0) {
    Mesh::~Mesh(this->m_unifiedMesh);
    Realloc(this->m_unifiedMesh,0,extraout_EDX_00,in_RCX,in_R8D);
  }
  if (this->m_unmodifiedUnifiedMesh != (Mesh *)0x0) {
    Mesh::~Mesh(this->m_unmodifiedUnifiedMesh);
    Realloc(this->m_unmodifiedUnifiedMesh,0,extraout_EDX_01,in_RCX,in_R8D);
  }
  ArrayBase::~ArrayBase(&(this->m_chartToUnifiedMap).m_base);
  ArrayBase::~ArrayBase(&(this->m_chartToOriginalMap).m_base);
  ArrayBase::~ArrayBase(&(this->m_faceArray).m_base);
  return;
}

Assistant:

~Chart()
	{
		if (m_mesh) {
			m_mesh->~Mesh();
			XA_FREE(m_mesh);
		}
		if (m_unifiedMesh) {
			m_unifiedMesh->~Mesh();
			XA_FREE(m_unifiedMesh);
		}
		if (m_unmodifiedUnifiedMesh) {
			m_unmodifiedUnifiedMesh->~Mesh();
			XA_FREE(m_unmodifiedUnifiedMesh);
		}
	}